

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

void __thiscall
spvtools::opt::Function::ReorderBasicBlocks<std::_List_iterator<spvtools::opt::BasicBlock*>>
          (Function *this,_List_iterator<spvtools::opt::BasicBlock_*> begin,
          _List_iterator<spvtools::opt::BasicBlock_*> end)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  Function *this_local;
  _List_iterator<spvtools::opt::BasicBlock_*> end_local;
  _List_iterator<spvtools::opt::BasicBlock_*> begin_local;
  
  bVar1 = ContainsAllBlocksInTheFunction<std::_List_iterator<spvtools::opt::BasicBlock*>>
                    (this,begin,end);
  if (!bVar1) {
    __assert_fail("ContainsAllBlocksInTheFunction(begin, end)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/function.h"
                  ,0x119,
                  "void spvtools::opt::Function::ReorderBasicBlocks(It, It) [It = std::_List_iterator<spvtools::opt::BasicBlock *>]"
                 );
  }
  iVar2 = std::
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          ::begin(&this->blocks_);
  iVar3 = std::
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          ::end(&this->blocks_);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>,spvtools::opt::Function::ReorderBasicBlocks<std::_List_iterator<spvtools::opt::BasicBlock*>>(std::_List_iterator<spvtools::opt::BasicBlock*>,std::_List_iterator<spvtools::opt::BasicBlock*>)::_lambda(std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>&)_1_>
            (iVar2._M_current,iVar3._M_current);
  iVar2 = std::
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          ::begin(&this->blocks_);
  std::
  transform<std::_List_iterator<spvtools::opt::BasicBlock*>,__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>,spvtools::opt::Function::ReorderBasicBlocks<std::_List_iterator<spvtools::opt::BasicBlock*>>(std::_List_iterator<spvtools::opt::BasicBlock*>,std::_List_iterator<spvtools::opt::BasicBlock*>)::_lambda(spvtools::opt::BasicBlock*)_1_>
            (begin._M_node,end._M_node,iVar2._M_current);
  return;
}

Assistant:

void Function::ReorderBasicBlocks(It begin, It end) {
  // Asserts to make sure every node in the function is in new_order.
  assert(ContainsAllBlocksInTheFunction(begin, end));

  // We have a pointer to all the elements in order, so we can release all
  // pointers in |block_|, and then create the new unique pointers from |{begin,
  // end}|.
  std::for_each(blocks_.begin(), blocks_.end(),
                [](std::unique_ptr<BasicBlock>& bb) { bb.release(); });
  std::transform(begin, end, blocks_.begin(), [](BasicBlock* bb) {
    return std::unique_ptr<BasicBlock>(bb);
  });
}